

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O0

void __thiscall FTextureManager::AddTexturesForWad(FTextureManager *this,int wadnum)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  FTexture *texture;
  FTexture *out;
  int local_48;
  int ns;
  FString local_38;
  FString Name;
  int local_28;
  bool skin;
  int i;
  int lasttx;
  int firsttx;
  int lumpcount;
  int firsttexture;
  int wadnum_local;
  FTextureManager *this_local;
  
  lumpcount = wadnum;
  _firsttexture = this;
  firsttx = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::Size
                      (&this->Textures);
  FWadCollection::GetNumLumps(&Wads);
  TArray<int,_int>::Push(&this->FirstTextureForFile,&firsttx);
  AddGroup(this,lumpcount,1,3);
  AddGroup(this,lumpcount,0xe,4);
  LoadTextureX(this,lumpcount);
  AddGroup(this,lumpcount,2,2);
  AddGroup(this,lumpcount,5,10);
  local_28 = FWadCollection::GetFirstLump(&Wads,lumpcount);
  iVar2 = FWadCollection::GetLastLump(&Wads,lumpcount);
  do {
    if (iVar2 < local_28) {
      LoadTextureDefs(this,lumpcount,"TEXTURES");
      LoadTextureDefs(this,lumpcount,"HIRESTEX");
      AddHiresTextures(this,lumpcount);
      iVar2 = firsttx;
      uVar3 = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::Size
                        (&this->Textures);
      SortTexturesByType(this,iVar2,uVar3);
      return;
    }
    Name.Chars._7_1_ = 0;
    FString::FString(&local_38);
    FWadCollection::GetLumpName(&Wads,&local_38,local_28);
    local_48 = FWadCollection::GetLumpNamespace(&Wads,local_28);
    if (local_48 == 0) {
      uVar3 = FWadCollection::GetLumpFlags(&Wads,local_28);
      if ((uVar3 & 2) == 0) {
        bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"");
        if (bVar1) {
          out._4_4_ = 4;
        }
        else {
          bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"THINGS");
          if (bVar1) {
            out._4_4_ = 4;
          }
          else {
            bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"LINEDEFS");
            if (bVar1) {
              out._4_4_ = 4;
            }
            else {
              bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"SIDEDEFS");
              if (bVar1) {
                out._4_4_ = 4;
              }
              else {
                bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"VERTEXES");
                if (bVar1) {
                  out._4_4_ = 4;
                }
                else {
                  bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"SEGS");
                  if (bVar1) {
                    out._4_4_ = 4;
                  }
                  else {
                    bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"SSECTORS");
                    if (bVar1) {
                      out._4_4_ = 4;
                    }
                    else {
                      bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"NODES");
                      if (bVar1) {
                        out._4_4_ = 4;
                      }
                      else {
                        bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"SECTORS");
                        if (bVar1) {
                          out._4_4_ = 4;
                        }
                        else {
                          bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"REJECT");
                          if (bVar1) {
                            out._4_4_ = 4;
                          }
                          else {
                            bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"BLOCKMAP");
                            if (bVar1) {
                              out._4_4_ = 4;
                            }
                            else {
                              bVar1 = FWadCollection::CheckLumpName(&Wads,local_28,"BEHAVIOR");
                              if (bVar1) {
                                out._4_4_ = 4;
                              }
                              else {
                                pcVar5 = FString::operator_cast_to_char_(&local_38);
                                iVar4 = FWadCollection::CheckNumForName(&Wads,pcVar5,0xf);
                                if (iVar4 == local_28) {
                                  pcVar5 = FString::operator_cast_to_char_(&local_38);
                                  out._0_4_ = CheckForTexture(this,pcVar5,4,0);
                                  bVar1 = FTextureID::Exists((FTextureID *)&out);
                                  if (!bVar1) goto LAB_00877e2a;
                                  out._4_4_ = 4;
                                }
                                else {
                                  out._4_4_ = 4;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        out._4_4_ = 4;
      }
    }
    else if (local_48 == 0xf) {
      pcVar5 = FString::operator_cast_to_char_(&local_38);
      iVar4 = FWadCollection::CheckNumForName(&Wads,pcVar5,0xf);
      if (iVar4 == local_28) {
LAB_00877e2a:
        texture = FTexture::CreateTexture(local_28,(Name.Chars._7_1_ & 1) * 4 + 8);
        if (texture != (FTexture *)0x0) {
          AddTexture(this,texture);
        }
        out._4_4_ = 0;
      }
      else {
        out._4_4_ = 4;
      }
    }
    else if (local_48 < 0x11) {
      out._4_4_ = 4;
    }
    else {
      pcVar5 = FString::operator_cast_to_char_(&local_38);
      iVar4 = FWadCollection::CheckNumForName(&Wads,pcVar5,local_48);
      if (iVar4 == local_28) {
        Name.Chars._7_1_ = 1;
        goto LAB_00877e2a;
      }
      out._4_4_ = 4;
    }
    FString::~FString(&local_38);
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void FTextureManager::AddTexturesForWad(int wadnum)
{
	int firsttexture = Textures.Size();
	int lumpcount = Wads.GetNumLumps();

	FirstTextureForFile.Push(firsttexture);

	// First step: Load sprites
	AddGroup(wadnum, ns_sprites, FTexture::TEX_Sprite);

	// When loading a Zip, all graphics in the patches/ directory should be
	// added as well.
	AddGroup(wadnum, ns_patches, FTexture::TEX_WallPatch);

	// Second step: TEXTUREx lumps
	LoadTextureX(wadnum);

	// Third step: Flats
	AddGroup(wadnum, ns_flats, FTexture::TEX_Flat);

	// Fourth step: Textures (TX_)
	AddGroup(wadnum, ns_newtextures, FTexture::TEX_Override);

	// Sixth step: Try to find any lump in the WAD that may be a texture and load as a TEX_MiscPatch
	int firsttx = Wads.GetFirstLump(wadnum);
	int lasttx = Wads.GetLastLump(wadnum);

	for (int i= firsttx; i <= lasttx; i++)
	{
		bool skin = false;
		FString Name;
		Wads.GetLumpName(Name, i);

		// Ignore anything not in the global namespace
		int ns = Wads.GetLumpNamespace(i);
		if (ns == ns_global)
		{
			// In Zips all graphics must be in a separate namespace.
			if (Wads.GetLumpFlags(i) & LUMPF_ZIPFILE) continue;

			// Ignore lumps with empty names.
			if (Wads.CheckLumpName(i, "")) continue;

			// Ignore anything belonging to a map
			if (Wads.CheckLumpName(i, "THINGS")) continue;
			if (Wads.CheckLumpName(i, "LINEDEFS")) continue;
			if (Wads.CheckLumpName(i, "SIDEDEFS")) continue;
			if (Wads.CheckLumpName(i, "VERTEXES")) continue;
			if (Wads.CheckLumpName(i, "SEGS")) continue;
			if (Wads.CheckLumpName(i, "SSECTORS")) continue;
			if (Wads.CheckLumpName(i, "NODES")) continue;
			if (Wads.CheckLumpName(i, "SECTORS")) continue;
			if (Wads.CheckLumpName(i, "REJECT")) continue;
			if (Wads.CheckLumpName(i, "BLOCKMAP")) continue;
			if (Wads.CheckLumpName(i, "BEHAVIOR")) continue;

			// Don't bother looking at this lump if something later overrides it.
			if (Wads.CheckNumForName(Name, ns_graphics) != i) continue;

			// skip this if it has already been added as a wall patch.
			if (CheckForTexture(Name, FTexture::TEX_WallPatch, 0).Exists()) continue;
		}
		else if (ns == ns_graphics)
		{
			// Don't bother looking this lump if something later overrides it.
			if (Wads.CheckNumForName(Name, ns_graphics) != i) continue;
		}
		else if (ns >= ns_firstskin)
		{
			// Don't bother looking this lump if something later overrides it.
			if (Wads.CheckNumForName(Name, ns) != i) continue;
			skin = true;
		}
		else continue;

		// Try to create a texture from this lump and add it.
		// Unfortunately we have to look at everything that comes through here...
		FTexture *out = FTexture::CreateTexture(i, skin ? FTexture::TEX_SkinGraphic : FTexture::TEX_MiscPatch);

		if (out != NULL) 
		{
			AddTexture (out);
		}
	}

	// Check for text based texture definitions
	LoadTextureDefs(wadnum, "TEXTURES");
	LoadTextureDefs(wadnum, "HIRESTEX");

	// Seventh step: Check for hires replacements.
	AddHiresTextures(wadnum);

	SortTexturesByType(firsttexture, Textures.Size());
}